

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

int ON_Solve3x3(double *row0,double *row1,double *row2,double d0,double d1,double d2,double *x_addr,
               double *y_addr,double *z_addr,double *pivot_ratio)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  char cVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double local_d0;
  double local_c8;
  
  *z_addr = 0.0;
  *y_addr = 0.0;
  *x_addr = 0.0;
  *pivot_ratio = 0.0;
  dVar12 = *row0;
  dVar20 = row0[1];
  dVar28 = ABS(dVar12);
  dVar24 = ABS(dVar20);
  cVar7 = dVar28 < dVar24;
  if (dVar24 <= dVar28) {
    dVar24 = dVar28;
  }
  dVar28 = row0[2];
  if (dVar24 < ABS(dVar28)) {
    cVar7 = '\x02';
    dVar24 = ABS(dVar28);
  }
  dVar31 = *row1;
  dVar23 = ABS(dVar31);
  iVar4 = 0;
  if (dVar24 < dVar23) {
    cVar7 = '\0';
  }
  dVar10 = row1[1];
  dVar15 = dVar23;
  if (dVar23 <= dVar24) {
    dVar15 = dVar24;
  }
  dVar19 = ABS(dVar10);
  dVar26 = dVar15;
  if (dVar15 < dVar19) {
    cVar7 = '\x01';
    dVar26 = dVar19;
  }
  dVar18 = row1[2];
  dVar25 = ABS(dVar18);
  dVar14 = dVar26;
  if (dVar26 < dVar25) {
    cVar7 = '\x02';
    dVar14 = dVar25;
  }
  dVar22 = *row2;
  dVar17 = ABS(dVar22);
  dVar13 = dVar14;
  if (dVar14 < dVar17) {
    cVar7 = '\0';
    dVar13 = dVar17;
  }
  dVar27 = row2[1];
  dVar16 = ABS(dVar27);
  dVar29 = dVar13;
  if (dVar13 < dVar16) {
    cVar7 = '\x01';
    dVar29 = dVar16;
  }
  dVar30 = row2[2];
  dVar21 = ABS(dVar30);
  dVar11 = dVar29;
  if (dVar29 < dVar21) {
    cVar7 = '\x02';
    dVar11 = dVar21;
  }
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    bVar3 = (-(dVar24 < dVar23) | -(dVar15 < dVar19)) & 1U | dVar26 < dVar25;
    if (dVar29 < dVar21) {
      bVar3 = 2;
    }
    if (dVar13 < dVar16) {
      bVar3 = 2;
    }
    if (dVar14 < dVar17) {
      bVar3 = 2;
    }
    dVar24 = dVar18;
    dVar15 = dVar28;
    local_c8 = d0;
    dVar26 = dVar20;
    dVar19 = dVar31;
    dVar14 = dVar27;
    dVar23 = d2;
    dVar25 = dVar12;
    local_d0 = d1;
    if ((bVar3 != 1) &&
       (dVar24 = dVar28, dVar15 = dVar18, local_c8 = d1, dVar26 = dVar10, dVar19 = dVar12,
       dVar10 = dVar20, dVar25 = dVar31, local_d0 = d0, bVar3 == 2)) {
      dVar24 = dVar30;
      dVar19 = dVar22;
      dVar30 = dVar28;
      dVar14 = dVar20;
      dVar22 = dVar12;
      dVar23 = d0;
      dVar10 = dVar27;
      local_d0 = d2;
    }
    pdVar5 = y_addr;
    pdVar8 = x_addr;
    pdVar9 = z_addr;
    dVar12 = dVar25;
    dVar20 = dVar30;
    dVar28 = dVar10;
    dVar31 = dVar22;
    dVar18 = dVar19;
    if ((cVar7 != '\x02') &&
       (pdVar8 = z_addr, pdVar9 = x_addr, dVar12 = dVar15, dVar20 = dVar22, dVar15 = dVar25,
       dVar31 = dVar30, dVar18 = dVar24, dVar24 = dVar19, cVar7 == '\x01')) {
      pdVar5 = x_addr;
      pdVar9 = y_addr;
      dVar20 = dVar14;
      dVar15 = dVar26;
      dVar28 = dVar19;
      dVar26 = dVar25;
      dVar14 = dVar22;
      dVar24 = dVar10;
    }
    dVar24 = 1.0 / dVar24;
    dVar28 = dVar28 * dVar24;
    dVar18 = dVar18 * dVar24;
    dVar24 = dVar24 * local_d0;
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      dVar26 = dVar26 - dVar15 * dVar28;
      dVar12 = dVar12 - dVar15 * dVar18;
      local_c8 = local_c8 - dVar15 * dVar24;
    }
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      dVar14 = dVar14 - dVar20 * dVar28;
      dVar31 = dVar31 - dVar20 * dVar18;
      dVar23 = dVar23 - dVar20 * dVar24;
    }
    dVar10 = ABS(dVar26);
    dVar15 = ABS(dVar12);
    dVar20 = dVar15;
    if (dVar15 <= dVar10) {
      dVar20 = dVar10;
    }
    dVar25 = ABS(dVar14);
    bVar1 = dVar25 <= dVar20;
    dVar19 = dVar25;
    if (dVar25 <= dVar20) {
      dVar19 = dVar20;
    }
    dVar22 = ABS(dVar31);
    bVar2 = dVar22 <= dVar19;
    if (dVar22 <= dVar19) {
      dVar22 = dVar19;
    }
    iVar4 = 1;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      dVar11 = ABS(dVar11);
      dVar19 = dVar22;
      if ((dVar11 < dVar22) || (dVar19 = dVar11, dVar11 <= dVar22)) {
        dVar22 = dVar11;
      }
      pdVar6 = pdVar8;
      dVar13 = dVar26;
      dVar17 = dVar31;
      dVar27 = dVar18;
      if (dVar10 < dVar15 && dVar25 <= dVar20 || !bVar2) {
        pdVar6 = pdVar5;
        pdVar5 = pdVar8;
        dVar13 = dVar12;
        dVar17 = dVar14;
        dVar12 = dVar26;
        dVar14 = dVar31;
        dVar27 = dVar28;
        dVar28 = dVar18;
      }
      dVar20 = dVar14;
      if (bVar1 && bVar2) {
        dVar20 = dVar13;
      }
      dVar20 = 1.0 / dVar20;
      dVar31 = dVar17;
      if (bVar1 && bVar2) {
        dVar31 = dVar12;
      }
      dVar31 = dVar31 * dVar20;
      if (bVar1 && bVar2) {
        local_c8 = dVar20 * local_c8;
        dVar12 = dVar31;
        dVar20 = local_c8;
        dVar10 = dVar17;
      }
      else {
        dVar23 = dVar20 * dVar23;
        dVar17 = dVar31;
        dVar20 = dVar23;
        dVar10 = dVar12;
      }
      if ((dVar28 != 0.0) || (NAN(dVar28))) {
        dVar27 = dVar27 - dVar28 * dVar31;
        dVar24 = dVar24 - dVar20 * dVar28;
      }
      if (bVar1 && bVar2) {
        dVar13 = dVar14;
      }
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        dVar10 = dVar10 - dVar31 * dVar13;
        if (bVar1 && bVar2) {
          dVar23 = dVar23 + -dVar13 * local_c8;
          dVar17 = dVar10;
        }
        else {
          local_c8 = local_c8 + -dVar13 * dVar23;
          dVar12 = dVar10;
        }
      }
      iVar4 = 2;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar20 = ABS(dVar10);
        dVar28 = dVar20;
        if ((dVar19 < dVar20) || (dVar28 = dVar19, dVar22 <= dVar20)) {
          dVar20 = dVar22;
          dVar19 = dVar28;
        }
        dVar28 = local_c8;
        if (bVar1 && bVar2) {
          dVar28 = dVar23;
        }
        dVar28 = dVar28 / dVar10;
        dVar31 = dVar23;
        dVar10 = dVar28;
        if (bVar1 && bVar2) {
          dVar23 = dVar28;
          dVar17 = dVar12;
          dVar31 = local_c8;
          dVar10 = local_c8;
        }
        if (((dVar17 != 0.0) || (dVar12 = dVar10, NAN(dVar17))) &&
           (dVar12 = dVar31 - dVar17 * dVar28, !bVar1 || !bVar2)) {
          dVar23 = dVar12;
          dVar12 = dVar10;
        }
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          dVar28 = dVar12;
          if (bVar1 && bVar2) {
            dVar28 = dVar23;
          }
          dVar24 = dVar24 - dVar27 * dVar28;
        }
        *pdVar9 = dVar24;
        dVar24 = dVar23;
        if (bVar1 && bVar2) {
          dVar24 = dVar12;
          dVar12 = dVar23;
        }
        *pdVar5 = dVar24;
        *pdVar6 = dVar12;
        *pivot_ratio = dVar20 / dVar19;
        iVar4 = 3;
      }
    }
  }
  return iVar4;
}

Assistant:

int
ON_Solve3x3(const double row0[3], const double row1[3], const double row2[3],
                double d0, double d1, double d2,
                double* x_addr, double* y_addr, double* z_addr,
                double* pivot_ratio)
{
  /* Solve a 3x3 linear system using Gauss-Jordan elimination 
   * with full pivoting.
   */
  int i, j;
  double* p0;
  double* p1;
  double* p2;
  double x, y, workarray[12], maxpiv, minpiv;

  const int sizeof_row = 3*sizeof(row0[0]);

  *pivot_ratio = *x_addr = *y_addr = *z_addr = 0.0;
  x = fabs(row0[0]); i=j=0;
  y = fabs(row0[1]); if (y>x) {x=y;j=1;}
  y = fabs(row0[2]); if (y>x) {x=y;j=2;}
  y = fabs(row1[0]); if (y>x) {x=y;i=1;j=0;}
  y = fabs(row1[1]); if (y>x) {x=y;i=1;j=1;}
  y = fabs(row1[2]); if (y>x) {x=y;i=1;j=2;}
  y = fabs(row2[0]); if (y>x) {x=y;i=2;j=0;}
  y = fabs(row2[1]); if (y>x) {x=y;i=2;j=1;}
  y = fabs(row2[2]); if (y>x) {x=y;i=2;j=2;}
  if (x == 0.0) 
    return 0;
  maxpiv = minpiv = fabs(x);
  p0 = workarray;
  switch(i) {
  case 1: /* swap rows 0 and 1 */
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  case 2: /* swap rows 0 and 2 */
    memcpy(p0,row2,sizeof_row); p0[3] = d2; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0;
    break;
  default:
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  }
  switch(j) {
  case 1: /* swap columns 0 and 1 */
    p0 = x_addr; x_addr = y_addr; y_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x;
    break;
  case 2: /* swap columns 0 and 2 */
    p0 = x_addr; x_addr = z_addr; z_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x;
    break;
  }

  x = 1.0/workarray[0];
  /* debugger set workarray[0] = 1 */
  p0 = p1 = workarray + 1;
  *p1++ *= x; *p1++ *= x; *p1++ *= x;
  x = -(*p1++);
  /* debugger set workarray[4] = 0 */
  if (x == 0.0) 
    p1 += 3;
  else 
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}
  x = -(*p1++);
  /* debugger set workarray[8] = 0 */
  if (x != 0.0)
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}

  x = fabs(workarray[ 5]);i=j=0;
  y = fabs(workarray[ 6]);if (y>x) {x=y;j=1;}
  y = fabs(workarray[ 9]);if (y>x) {x=y;i=1;j=0;}
  y = fabs(workarray[10]);if (y>x) {x=y;i=j=1;}
  if (x == 0.0) 
    return 1; // rank = 1;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  if (j) {
    /* swap columns 1 and 2 */
    p0 = workarray+1;
    p1 = p0+1;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    p0 = y_addr; y_addr = z_addr; z_addr = p0;
  }

  if (i) {
    /* pivot is in row 2 */
    p0 = workarray+1;
    p1 = p0 + 8;
    p2 = p0 + 4;
  }
  else {
    /* pivot is in row 1 */
    p0 = workarray+1;
    p1 = p0 + 4;
    p2 = p0 + 8;
  }

  /* debugger set workarray[5+4*i] = 1 */
  x = 1.0/(*p1++); *p1++ *= x; *p1 *= x; p1--;
  x = -(*p0++);
  /* debugger set p0[-1] = 0 */
  if (x != 0.0) {*p0++ += x*(*p1++); *p0 += x*(*p1); p0--; p1--;}
  x = -(*p2++);
  /* debugger set p2[-1] = 0 */
  if (x != 0.0) {*p2++ += x*(*p1++); *p2 += x*(*p1); p2--; p1--;}
  x = *p2++;
  if (x == 0.0) 
    return 2; // rank = 2;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  /* debugger set p2[-1] = 1 */
  *p2 /= x;
  x = -(*p1++);  if (x != 0.0) *p1 += x*(*p2);
  /* debugger set p1[-1] = 0 */
  x = -(*p0++);  if (x != 0.0) *p0 += x*(*p2);
  /* debugger set p0[-1] = 0 */
  *x_addr = workarray[3];
  if (i) {
    *y_addr = workarray[11];
    *z_addr = workarray[7];
  }
  else {
    *y_addr = workarray[7];
    *z_addr = workarray[11];
  }
  *pivot_ratio = minpiv/maxpiv;
  return 3;
}